

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void glist_text(_glist *gl,t_symbol *s,int argc,t_atom *argv)

{
  byte *pbVar1;
  t_gobj *y;
  _glist *p_Var2;
  t_symbol *sel;
  _glist *x;
  _glist *x_00;
  void *data;
  int iVar3;
  t_pd x_01;
  t_atom *argv_00;
  t_float tVar4;
  int ypix;
  int xpix;
  t_atom at;
  int local_48;
  int local_44;
  t_atom local_40;
  
  y = (t_gobj *)pd_new(text_class);
  *(undefined2 *)((long)&y[2].g_next + 4) = 0;
  pbVar1 = (byte *)((long)&y[2].g_next + 6);
  *pbVar1 = *pbVar1 & 0xfc;
  p_Var2 = (_glist *)binbuf_new();
  y[1].g_pd = (t_pd)p_Var2;
  if (argc < 2) {
    p_Var2 = glist_getcanvas(p_Var2);
    sel = gensym("editmode");
    pd_vmess((t_pd *)p_Var2,sel,"i",1);
    local_40.a_type = A_SYMBOL;
    local_40.a_w.w_symbol = gensym("comment");
    glist_noselect(gl);
    glist_nograb(gl);
    glist_getnextxy(gl,&local_44,&local_48);
    iVar3 = gl->gl_zoom;
    *(short *)&y[2].g_next = (short)(local_44 / iVar3) + -1;
    *(short *)((long)&y[2].g_next + 2) = (short)(local_48 / iVar3) + -1;
    binbuf_restore((_binbuf *)y[1].g_pd,1,&local_40);
    glist_add(gl,y);
    glist_noselect(gl);
    glist_select(gl,y);
    p_Var2 = glist_getcanvas(x);
    p_Var2 = (_glist *)canvas_undo_get(p_Var2);
    if (*(int *)&(p_Var2->gl_obj).te_outlet == 0) {
      p_Var2 = glist_getcanvas(p_Var2);
      x_00 = glist_getcanvas(p_Var2);
      data = canvas_undo_set_create(x_00);
      p_Var2 = (_glist *)canvas_undo_add(p_Var2,UNDO_CREATE,"create",data);
    }
    p_Var2 = glist_getcanvas(p_Var2);
    canvas_startmotion(p_Var2);
  }
  else {
    tVar4 = atom_getfloatarg(0,argc,argv);
    *(short *)&y[2].g_next = (short)(int)tVar4;
    tVar4 = atom_getfloatarg(1,argc,argv);
    *(short *)((long)&y[2].g_next + 2) = (short)(int)tVar4;
    if (argc == 2) {
      argv_00 = &local_40;
      local_40.a_type = A_SYMBOL;
      local_40.a_w.w_symbol = gensym("comment");
      x_01 = y[1].g_pd;
      iVar3 = 1;
    }
    else {
      x_01 = y[1].g_pd;
      iVar3 = argc + -2;
      argv_00 = argv + 2;
    }
    binbuf_restore((_binbuf *)x_01,iVar3,argv_00);
    glist_add(gl,y);
  }
  return;
}

Assistant:

void glist_text(t_glist *gl, t_symbol *s, int argc, t_atom *argv)
{
    t_text *x = (t_text *)pd_new(text_class);
    t_atom at;
    x->te_width = 0;                            /* don't know it yet. */
    x->te_type = T_TEXT;
    x->te_binbuf = binbuf_new();
    if (argc > 1)
    {
        x->te_xpix = atom_getfloatarg(0, argc, argv);
        x->te_ypix = atom_getfloatarg(1, argc, argv);
        if (argc > 2) binbuf_restore(x->te_binbuf, argc-2, argv+2);
        else
        {
            SETSYMBOL(&at, gensym("comment"));
            binbuf_restore(x->te_binbuf, 1, &at);
        }
        glist_add(gl, &x->te_g);
    }
    else
    {
        int xpix, ypix;
        pd_vmess((t_pd *)glist_getcanvas(gl), gensym("editmode"), "i", 1);
        SETSYMBOL(&at, gensym("comment"));
        glist_noselect(gl);
        glist_nograb(gl);
        glist_getnextxy(gl, &xpix, &ypix);
        x->te_xpix = xpix/gl->gl_zoom - 1;
        x->te_ypix = ypix/gl->gl_zoom - 1;
        binbuf_restore(x->te_binbuf, 1, &at);
        glist_add(gl, &x->te_g);
        glist_noselect(gl);
        glist_select(gl, &x->te_g);
            /* it would be nice to "activate" here, but then the second,
            "put-me-down" click changes the text selection, which is quite
            irritating, so I took this back out.  It's OK in messages
            and objects though since there's no text in them at menu
            creation. */
            /* gobj_activate(&x->te_g, gl, 1); */
        if (!canvas_undo_get(glist_getcanvas(gl))->u_doing)
            canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
                (void *)canvas_undo_set_create(glist_getcanvas(gl)));
        canvas_startmotion(glist_getcanvas(gl));
    }
}